

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t acl_special(archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag)

{
  wchar_t wVar1;
  uint uVar2;
  
  wVar1 = L'\x01';
  if ((uint)permset < 8 && type == L'Ā') {
    if (tag == L'✖') {
      uVar2 = acl->mode & 0xfffffff8 | permset;
    }
    else if (tag == L'✔') {
      uVar2 = (acl->mode & 0xffffffc7) + permset * 8;
    }
    else {
      if (tag != L'✒') {
        return L'\x01';
      }
      uVar2 = permset << 6 | acl->mode & 0xfffffe3f;
    }
    acl->mode = uVar2;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
acl_special(struct archive_acl *acl, int type, int permset, int tag)
{
	if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
	    && ((permset & ~007) == 0)) {
		switch (tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			acl->mode &= ~0700;
			acl->mode |= (permset & 7) << 6;
			return (0);
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			acl->mode &= ~0070;
			acl->mode |= (permset & 7) << 3;
			return (0);
		case ARCHIVE_ENTRY_ACL_OTHER:
			acl->mode &= ~0007;
			acl->mode |= permset & 7;
			return (0);
		}
	}
	return (1);
}